

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::getWordVector(FastText *this,Vector *vec,string *word)

{
  FastText *this_00;
  FastText *pFVar1;
  size_type sVar2;
  Vector *in_RSI;
  undefined8 in_RDI;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  string *in_stack_00000010;
  Dictionary *in_stack_00000018;
  int i;
  vector<int,_std::allocator<int>_> *ngrams;
  undefined8 in_stack_ffffffffffffff90;
  Vector *vec_00;
  Vector *in_stack_ffffffffffffffa0;
  real a;
  vector<int,_std::allocator<int>_> *this_01;
  int local_48;
  vector<int,_std::allocator<int>_> local_38;
  vector<int,_std::allocator<int>_> *local_20;
  Vector *local_10;
  
  local_10 = in_RSI;
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x198286);
  this_01 = &local_38;
  Dictionary::getSubwords(in_stack_00000018,in_stack_00000010);
  local_20 = this_01;
  Vector::zero(in_stack_ffffffffffffffa0);
  local_48 = 0;
  while( true ) {
    this_00 = (FastText *)(long)local_48;
    pFVar1 = (FastText *)std::vector<int,_std::allocator<int>_>::size(local_20);
    a = (real)((ulong)in_RDI >> 0x20);
    auVar3 = in_ZMM0._0_16_;
    if (pFVar1 <= this_00) break;
    vec_00 = local_10;
    std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)local_48);
    addInputVector(this_00,vec_00,(int32_t)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    local_48 = local_48 + 1;
  }
  sVar2 = std::vector<int,_std::allocator<int>_>::size(local_20);
  if (sVar2 != 0) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(local_20);
    vcvtusi2sd_avx512f(auVar3,sVar2);
    Vector::mul((Vector *)this_01,a);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  return;
}

Assistant:

void FastText::getWordVector(Vector& vec, const std::string& word) const {
  const std::vector<int32_t>& ngrams = dict_->getSubwords(word);
  vec.zero();
  for (int i = 0; i < ngrams.size(); i++) {
    addInputVector(vec, ngrams[i]);
  }
  if (ngrams.size() > 0) {
    vec.mul(1.0 / ngrams.size());
  }
}